

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O3

void DNA::fromCStr(Base *dest,size_t dest_size,char *src)

{
  byte bVar1;
  size_t sVar2;
  Base BVar3;
  
  if (dest_size != 0) {
    sVar2 = 0;
    do {
      bVar1 = src[sVar2];
      if (bVar1 < 0x61) {
        if (bVar1 < 0x47) {
          BVar3 = A;
          if (bVar1 != 0x41) {
            if (bVar1 != 0x43) {
              if (bVar1 == 0) {
                return;
              }
              goto LAB_0010126f;
            }
LAB_0010123c:
            BVar3 = C;
          }
        }
        else if (bVar1 == 0x47) {
LAB_00101262:
          BVar3 = G;
        }
        else {
          if (bVar1 != 0x54) goto LAB_0010126f;
LAB_0010125a:
          BVar3 = T;
        }
LAB_00101268:
        *dest = BVar3;
        dest = dest + 1;
      }
      else if (bVar1 < 0x67) {
        BVar3 = A;
        if (bVar1 == 0x61) goto LAB_00101268;
        if (bVar1 == 99) goto LAB_0010123c;
      }
      else {
        if (bVar1 == 0x67) goto LAB_00101262;
        if (bVar1 == 0x74) goto LAB_0010125a;
      }
LAB_0010126f:
      sVar2 = sVar2 + 1;
    } while (dest_size != sVar2);
  }
  return;
}

Assistant:

void DNA::fromCStr(DNA::Base* dest, size_t dest_size, const char* src)
{
    while (dest_size-- && *src) {
        switch (*src) {
            case 'a':
            case 'A':
                *dest++ = A;
                break;
            case 'c':
            case 'C':
                *dest++ = C;
                break;
            case 'g':
            case 'G':
                *dest++ = G;
                break;
            case 't':
            case 'T':
                *dest++ = T;
                break;
            default:
                // Ignore non DNA chars
                break;
        }
        ++src;
    }
}